

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::FramebufferGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator=
          (RefCntAutoPtr<Diligent::FramebufferGLImpl> *this,FramebufferGLImpl *pObj)

{
  FramebufferGLImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (FramebufferGLImpl *)0x0) {
      DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ::Release((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (FramebufferGLImpl *)0x0) {
      RefCountedObject<Diligent::IFramebuffer>::AddRef
                ((RefCountedObject<Diligent::IFramebuffer> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }